

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastDecoder(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iLit0;
  uint uVar1;
  ulong uVar2;
  
  vRes->nSize = 0;
  if (nNum != 0x1f) {
    uVar1 = 0;
    do {
      iLit0 = 1;
      if (0 < nNum) {
        uVar2 = 0;
        do {
          if (pNum[uVar2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iLit0 = Gia_ManHashAnd(pNew,iLit0,
                                 pNum[uVar2] ^ (uint)((~uVar1 >> ((uint)uVar2 & 0x1f) & 1) != 0));
          uVar2 = uVar2 + 1;
        } while ((uint)nNum != uVar2);
      }
      Vec_IntPush(vRes,iLit0);
      uVar1 = uVar1 + 1;
    } while (uVar1 != 1 << ((byte)nNum & 0x1f));
  }
  return;
}

Assistant:

void Wlc_BlastDecoder( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int i, k, nMints = 1 << nNum;
    Vec_IntClear( vRes );
    for ( i = 0; i < nMints; i++ )
    {
        int iMint = 1;
        for ( k = 0; k < nNum; k++ )
            iMint = Gia_ManHashAnd( pNew, iMint, Abc_LitNotCond(pNum[k], !((i >> k) & 1)) );
        Vec_IntPush( vRes, iMint );
    }
}